

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

int64_t __thiscall
icu_63::OlsonTimeZone::transitionTimeInSeconds(OlsonTimeZone *this,int16_t transIdx)

{
  short sVar1;
  int16_t transIdx_local;
  OlsonTimeZone *this_local;
  
  if (transIdx < this->transitionCountPre32) {
    this_local = (OlsonTimeZone *)
                 CONCAT44(this->transitionTimesPre32[(int)transIdx << 1],
                          this->transitionTimesPre32[transIdx * 2 + 1]);
  }
  else {
    sVar1 = transIdx - this->transitionCountPre32;
    if (sVar1 < this->transitionCount32) {
      this_local = (OlsonTimeZone *)(long)this->transitionTimes32[sVar1];
    }
    else {
      sVar1 = sVar1 - this->transitionCount32;
      this_local = (OlsonTimeZone *)
                   CONCAT44(this->transitionTimesPost32[(int)sVar1 << 1],
                            this->transitionTimesPost32[sVar1 * 2 + 1]);
    }
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
OlsonTimeZone::transitionTimeInSeconds(int16_t transIdx) const {
    U_ASSERT(transIdx >= 0 && transIdx < transitionCount()); 

    if (transIdx < transitionCountPre32) {
        return (((int64_t)((uint32_t)transitionTimesPre32[transIdx << 1])) << 32)
            | ((int64_t)((uint32_t)transitionTimesPre32[(transIdx << 1) + 1]));
    }

    transIdx -= transitionCountPre32;
    if (transIdx < transitionCount32) {
        return (int64_t)transitionTimes32[transIdx];
    }

    transIdx -= transitionCount32;
    return (((int64_t)((uint32_t)transitionTimesPost32[transIdx << 1])) << 32)
        | ((int64_t)((uint32_t)transitionTimesPost32[(transIdx << 1) + 1]));
}